

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O1

DdNode * cuddCofactorRecur(DdManager *dd,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *f_00;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (f_00->index == 0x7fffffff) {
    return f;
  }
  pDVar7 = dd->one;
  if (pDVar7 == g) {
    return f;
  }
  pDVar4 = cuddCacheLookup2(dd,Cudd_Cofactor,f_00,g);
  if (pDVar4 != (DdNode *)0x0) {
    return (DdNode *)((ulong)pDVar4 ^ (ulong)(f_00 != f));
  }
  uVar2 = dd->perm[f_00->index];
  pDVar9 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
  uVar3 = dd->perm[pDVar9->index];
  pDVar4 = f_00;
  pDVar6 = f_00;
  if (uVar2 <= uVar3) {
    pDVar4 = (f_00->type).kids.T;
    pDVar6 = (f_00->type).kids.E;
  }
  pDVar5 = g;
  pDVar8 = g;
  if (uVar3 <= uVar2) {
    pDVar5 = (pDVar9->type).kids.T;
    pDVar8 = (pDVar9->type).kids.E;
    if (pDVar9 != g) {
      pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
      pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
    }
  }
  if (uVar2 < uVar3) {
    pDVar4 = cuddCofactorRecur(dd,pDVar4,g);
    if (pDVar4 != (DdNode *)0x0) {
      pDVar9 = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
      pDVar9->ref = pDVar9->ref + 1;
      pDVar6 = cuddCofactorRecur(dd,pDVar6,g);
      if (pDVar6 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar7 = pDVar4;
        if (pDVar4 != pDVar6) {
          if (((ulong)pDVar4 & 1) == 0) {
            pDVar7 = cuddUniqueInter(dd,f_00->index,pDVar4,pDVar6);
          }
          else {
            pDVar7 = cuddUniqueInter(dd,f_00->index,pDVar9,(DdNode *)((ulong)pDVar6 ^ 1));
            if (pDVar7 == (DdNode *)0x0) {
              pDVar7 = (DdNode *)0x0;
            }
            else {
              pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
            }
          }
        }
        if (pDVar7 != (DdNode *)0x0) {
          pDVar9->ref = pDVar9->ref - 1;
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_007a3dbc;
        }
        Cudd_RecursiveDeref(dd,pDVar6);
      }
      Cudd_RecursiveDeref(dd,pDVar4);
    }
  }
  else {
    pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
    pDVar9 = pDVar5;
    if (((pDVar8 == pDVar7) || (pDVar8 == dd->zero)) ||
       (pDVar9 = pDVar8, pDVar4 = pDVar6, pDVar5 == pDVar7 || pDVar5 == dd->zero)) {
      pDVar7 = cuddCofactorRecur(dd,pDVar4,pDVar9);
      if (pDVar7 != (DdNode *)0x0) {
LAB_007a3dbc:
        cuddCacheInsert2(dd,Cudd_Cofactor,f_00,g,pDVar7);
        return (DdNode *)((ulong)(f_00 != f) ^ (ulong)pDVar7);
      }
    }
    else {
      fwrite("Cudd_Cofactor: Invalid restriction 2\n",0x25,1,(FILE *)dd->out);
      dd->errorCode = CUDD_INVALID_ARG;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddCofactorRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *one,*zero,*F,*G,*g1,*g0,*f1,*f0,*t,*e,*r;
    unsigned int topf,topg;
    int comple;

    statLine(dd);
    F = Cudd_Regular(f);
    if (cuddIsConstant(F)) return(f);

    one = DD_ONE(dd);

    /* The invariant g != 0 is true on entry to this procedure and is
    ** recursively maintained by it. Therefore it suffices to test g
    ** against one to make sure it is not constant.
    */
    if (g == one) return(f);
    /* From now on, f and g are known not to be constants. */

    comple = f != F;
    r = cuddCacheLookup2(dd,Cudd_Cofactor,F,g);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    topf = dd->perm[F->index];
    G = Cudd_Regular(g);
    topg = dd->perm[G->index];

    /* We take the cofactors of F because we are going to rely on
    ** the fact that the cofactors of the complement are the complements
    ** of the cofactors to better utilize the cache. Variable comple
    ** remembers whether we have to complement the result or not.
    */
    if (topf <= topg) {
        f1 = cuddT(F); f0 = cuddE(F);
    } else {
        f1 = f0 = F;
    }
    if (topg <= topf) {
        g1 = cuddT(G); g0 = cuddE(G);
        if (g != G) { g1 = Cudd_Not(g1); g0 = Cudd_Not(g0); }
    } else {
        g1 = g0 = g;
    }

    zero = Cudd_Not(one);
    if (topf >= topg) {
        if (g0 == zero || g0 == DD_ZERO(dd)) {
            r = cuddCofactorRecur(dd, f1, g1);
        } else if (g1 == zero || g1 == DD_ZERO(dd)) {
            r = cuddCofactorRecur(dd, f0, g0);
        } else {
            (void) fprintf(dd->out,
                           "Cudd_Cofactor: Invalid restriction 2\n");
            dd->errorCode = CUDD_INVALID_ARG;
            return(NULL);
        }
        if (r == NULL) return(NULL);
    } else /* if (topf < topg) */ {
        t = cuddCofactorRecur(dd, f1, g);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddCofactorRecur(dd, f0, g);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        cuddRef(e);

        if (t == e) {
            r = t;
        } else if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(dd,(int)F->index,Cudd_Not(t),Cudd_Not(e));
            if (r != NULL)
                r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(dd,(int)F->index,t,e);
        }
        if (r == NULL) {
            Cudd_RecursiveDeref(dd ,e);
            Cudd_RecursiveDeref(dd ,t);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(dd,Cudd_Cofactor,F,g,r);

    return(Cudd_NotCond(r,comple));

}